

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeCustom(AsciiParser *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  string tok;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  uVar1 = this->_sr->idx_;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar2 = ReadIdentifier(this,&local_38);
  if (bVar2) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_38);
    if (iVar3 == 0) {
      bVar2 = true;
      goto LAB_00320f54;
    }
  }
  if (uVar1 <= this->_sr->length_) {
    this->_sr->idx_ = uVar1;
  }
  bVar2 = false;
LAB_00320f54:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool AsciiParser::MaybeCustom() {
  std::string tok;

  auto loc = CurrLoc();
  bool ok = ReadIdentifier(&tok);

  if (!ok) {
    // revert
    SeekTo(loc);
    return false;
  }

  if (tok == "custom") {
    // cosume `custom` token.
    return true;
  }

  // revert
  SeekTo(loc);
  return false;
}